

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

void o_xtra_act(keypress ch,wchar_t oid)

{
  uint32_t *puVar1;
  _Bool _Var2;
  object_kind *kind;
  char *pcVar3;
  int16_t kind_00;
  char text [80];
  char local_68 [80];
  
  kind = objkind_byid(oid);
  if (kind != (object_kind *)0x0) {
    _Var2 = ignore_tval(kind->tval);
    if ((ch._0_8_ & 0xffffffdf00000000) == 0x5300000000 && _Var2) {
      if (kind->aware == true) {
        _Var2 = kind_is_ignored_aware(kind);
        if (!_Var2) {
          kind_ignore_when_aware(kind);
          return;
        }
      }
      else {
        _Var2 = kind_is_ignored_unaware(kind);
        if (!_Var2) {
          kind_ignore_when_unaware(kind);
          return;
        }
      }
      kind_ignore_clear(kind);
      return;
    }
    kind_00 = (int16_t)oid;
    if (ch._0_8_ >> 0x20 == 0x7b) {
      local_68[0x40] = '\0';
      local_68[0x41] = '\0';
      local_68[0x42] = '\0';
      local_68[0x43] = '\0';
      local_68[0x44] = '\0';
      local_68[0x45] = '\0';
      local_68[0x46] = '\0';
      local_68[0x47] = '\0';
      local_68[0x48] = '\0';
      local_68[0x49] = '\0';
      local_68[0x4a] = '\0';
      local_68[0x4b] = '\0';
      local_68[0x4c] = '\0';
      local_68[0x4d] = '\0';
      local_68[0x4e] = '\0';
      local_68[0x4f] = '\0';
      local_68[0x30] = '\0';
      local_68[0x31] = '\0';
      local_68[0x32] = '\0';
      local_68[0x33] = '\0';
      local_68[0x34] = '\0';
      local_68[0x35] = '\0';
      local_68[0x36] = '\0';
      local_68[0x37] = '\0';
      local_68[0x38] = '\0';
      local_68[0x39] = '\0';
      local_68[0x3a] = '\0';
      local_68[0x3b] = '\0';
      local_68[0x3c] = '\0';
      local_68[0x3d] = '\0';
      local_68[0x3e] = '\0';
      local_68[0x3f] = '\0';
      local_68[0x20] = '\0';
      local_68[0x21] = '\0';
      local_68[0x22] = '\0';
      local_68[0x23] = '\0';
      local_68[0x24] = '\0';
      local_68[0x25] = '\0';
      local_68[0x26] = '\0';
      local_68[0x27] = '\0';
      local_68[0x28] = '\0';
      local_68[0x29] = '\0';
      local_68[0x2a] = '\0';
      local_68[0x2b] = '\0';
      local_68[0x2c] = '\0';
      local_68[0x2d] = '\0';
      local_68[0x2e] = '\0';
      local_68[0x2f] = '\0';
      local_68[0x10] = '\0';
      local_68[0x11] = '\0';
      local_68[0x12] = '\0';
      local_68[0x13] = '\0';
      local_68[0x14] = '\0';
      local_68[0x15] = '\0';
      local_68[0x16] = '\0';
      local_68[0x17] = '\0';
      local_68[0x18] = '\0';
      local_68[0x19] = '\0';
      local_68[0x1a] = '\0';
      local_68[0x1b] = '\0';
      local_68[0x1c] = '\0';
      local_68[0x1d] = '\0';
      local_68[0x1e] = '\0';
      local_68[0x1f] = '\0';
      local_68[0] = '\0';
      local_68[1] = '\0';
      local_68[2] = '\0';
      local_68[3] = '\0';
      local_68[4] = '\0';
      local_68[5] = '\0';
      local_68[6] = '\0';
      local_68[7] = '\0';
      local_68[8] = '\0';
      local_68[9] = '\0';
      local_68[10] = '\0';
      local_68[0xb] = '\0';
      local_68[0xc] = '\0';
      local_68[0xd] = '\0';
      local_68[0xe] = '\0';
      local_68[0xf] = '\0';
      screen_save();
      prt("Inscribe with: ",L'\0',L'\0');
      if ((kind->note_aware != 0) || (kind->note_unaware != 0)) {
        pcVar3 = get_autoinscription(kind,kind->aware);
        strnfmt(local_68,0x50,"%s",pcVar3);
      }
      _Var2 = askfor_aux(local_68,0x50,
                         (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
      if (_Var2) {
        if ((kind->note_aware != 0) || (kind->note_unaware != 0)) {
          remove_autoinscription(kind_00);
        }
        add_autoinscription(kind_00,local_68,kind->aware);
        cmdq_push(CMD_AUTOINSCRIBE);
        puVar1 = &player->upkeep->redraw;
        *puVar1 = *puVar1 | 0x60000;
      }
      screen_load();
    }
    else if (ch.code == 0x7d) {
      remove_autoinscription(kind_00);
      return;
    }
  }
  return;
}

Assistant:

static void o_xtra_act(struct keypress ch, int oid)
{
	struct object_kind *k = objkind_byid(oid);
	if (!k) return;

	/* Toggle ignore */
	if (ignore_tval(k->tval) && (ch.code == 's' || ch.code == 'S')) {
		if (k->aware) {
			if (kind_is_ignored_aware(k))
				kind_ignore_clear(k);
			else
				kind_ignore_when_aware(k);
		} else {
			if (kind_is_ignored_unaware(k))
				kind_ignore_clear(k);
			else
				kind_ignore_when_unaware(k);
		}

		return;
	}

	/* Uninscribe */
	if (ch.code == '}') {
		remove_autoinscription(oid);
	} else if (ch.code == '{') {
		/* Inscribe */
		char text[80] = "";

		/* Avoid the prompt getting in the way */
		screen_save();

		/* Prompt */
		prt("Inscribe with: ", 0, 0);

		/* Default note */
		if (k->note_aware || k->note_unaware)
			strnfmt(text, sizeof(text), "%s", get_autoinscription(k, k->aware));

		/* Get an inscription */
		if (askfor_aux(text, sizeof(text), NULL)) {
			/* Remove old inscription if existent */
			if (k->note_aware || k->note_unaware)
				remove_autoinscription(oid);

			/* Add the autoinscription */
			add_autoinscription(oid, text, k->aware);
			cmdq_push(CMD_AUTOINSCRIBE);

			/* Redraw gear */
			player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);
		}

		/* Reload the screen */
		screen_load();
	}
}